

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMate.cpp
# Opt level: O1

void __thiscall
chrono::ChLinkMateGeneric::IntFromDescriptor
          (ChLinkMateGeneric *this,uint off_v,ChStateDelta *v,uint off_L,ChVectorDynamic<> *L)

{
  pointer ppCVar1;
  double *pdVar2;
  long lVar3;
  ChConstraintTwoBodies *pCVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  
  lVar5 = (long)(this->mask).nconstr;
  if (0 < lVar5) {
    ppCVar1 = (this->mask).constraints.
              super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pdVar2 = (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    lVar3 = (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
    lVar6 = 0;
    iVar7 = 0;
    do {
      if ((this->mask).nconstr <= lVar6) {
        __assert_fail("(i >= 0) && (i < nconstr)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChLinkMask.h"
                      ,0x37,"ChConstraintTwoBodies &chrono::ChLinkMask::Constr_N(int)");
      }
      pCVar4 = ppCVar1[lVar6];
      if ((pCVar4->super_ChConstraintTwo).super_ChConstraint.active == true) {
        if (lVar3 <= (long)(ulong)(iVar7 + off_L)) {
          __assert_fail("index >= 0 && index < size()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                       );
        }
        pdVar2[iVar7 + off_L] = (pCVar4->super_ChConstraintTwo).super_ChConstraint.l_i;
        iVar7 = iVar7 + 1;
      }
      lVar6 = lVar6 + 1;
    } while (lVar5 != lVar6);
  }
  return;
}

Assistant:

void ChLinkMateGeneric::IntFromDescriptor(const unsigned int off_v,
                                          ChStateDelta& v,
                                          const unsigned int off_L,
                                          ChVectorDynamic<>& L) {
    int cnt = 0;
    for (int i = 0; i < mask.nconstr; i++) {
        if (mask.Constr_N(i).IsActive()) {
            L(off_L + cnt) = mask.Constr_N(i).Get_l_i();
            cnt++;
        }
    }
}